

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

AtomicWait * __thiscall
wasm::Builder::makeAtomicWait
          (Builder *this,Expression *ptr,Expression *expected,Expression *timeout,Type expectedType,
          Address offset,Name memory)

{
  AtomicWait *this_00;
  
  this_00 = MixedArena::alloc<wasm::AtomicWait>(&this->wasm->allocator);
  (this_00->offset).addr = offset.addr;
  this_00->ptr = ptr;
  this_00->expected = expected;
  this_00->timeout = timeout;
  (this_00->expectedType).id = expectedType.id;
  AtomicWait::finalize(this_00);
  (this_00->memory).super_IString.str._M_len = memory.super_IString.str._M_len;
  (this_00->memory).super_IString.str._M_str = memory.super_IString.str._M_str;
  return this_00;
}

Assistant:

AtomicWait* makeAtomicWait(Expression* ptr,
                             Expression* expected,
                             Expression* timeout,
                             Type expectedType,
                             Address offset,
                             Name memory) {
    auto* wait = wasm.allocator.alloc<AtomicWait>();
    wait->offset = offset;
    wait->ptr = ptr;
    wait->expected = expected;
    wait->timeout = timeout;
    wait->expectedType = expectedType;
    wait->finalize();
    wait->memory = memory;
    return wait;
  }